

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O1

bool Eval::loadPatterns(void)

{
  bool bVar1;
  long lVar2;
  float fVar3;
  float value;
  ifstream in;
  float local_22c;
  long local_228 [4];
  byte abStack_208 [488];
  
  std::ifstream::ifstream(local_228,"./pattern.bin",_S_in|_S_bin);
  if ((abStack_208[*(long *)(local_228[0] + -0x18)] & 5) == 0) {
    lVar2 = 0;
    do {
      std::istream::read((char *)local_228,(long)&local_22c);
      if ((abStack_208[*(long *)(local_228[0] + -0x18)] & 5) != 0) {
        std::ifstream::close();
        goto LAB_00106869;
      }
      fVar3 = roundf(local_22c * 10000.0);
      patternValues[lVar2] = (int)fVar3;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x2b6371);
    lVar2 = 0;
    do {
      std::istream::read((char *)local_228,(long)&local_22c);
      if ((abStack_208[*(long *)(local_228[0] + -0x18)] & 5) != 0) {
        std::ifstream::close();
        goto LAB_00106869;
      }
      fVar3 = roundf(local_22c);
      *(int *)((long)patternCorrection + lVar2) = (int)fVar3;
      lVar2 = lVar2 + 4;
    } while (lVar2 != 0x44);
    bVar1 = true;
    std::ifstream::close();
  }
  else {
LAB_00106869:
    bVar1 = false;
  }
  std::ifstream::~ifstream(local_228);
  return bVar1;
}

Assistant:

bool Eval::loadPatterns() {
    std::ifstream in("./pattern.bin", std::ios::binary | std::ios::in);
    if (!in) return false;
    float value;
    for (int i = 0; i < ALL_STAGE_PATTERN_COUNT; i++) {
        in.read((char*)&value, sizeof(value));
        if (!in) {
            in.close();
            return false;
        }
        patternValues[i] = (int)round(value * RULER);
    }
    for (int i = 0; i < STAGES; i++) {
        in.read((char*)&value, sizeof(value));
        if (!in) {
            in.close();
            return false;
        }
        patternCorrection[i] = (int)round(value);
    }
    in.close();
    return true;

}